

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

ostream * lest::operator<<(ostream *os,comment *note)

{
  bool local_42;
  allocator local_41;
  string local_40 [32];
  comment *local_20;
  comment *note_local;
  ostream *os_local;
  
  local_20 = note;
  note_local = (comment *)os;
  local_42 = comment::operator_cast_to_bool(note);
  if (local_42) {
    std::operator+((char *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e373);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
  }
  local_42 = !local_42;
  os_local = std::operator<<(os,local_40);
  std::__cxx11::string::~string(local_40);
  if (local_42) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return os_local;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}